

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O1

Bus_Man_t * Bus_ManStart(Abc_Ntk_t *pNtk,SC_Lib *pLib,SC_BusPars *pPars)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  char *__s;
  int iVar4;
  Bus_Man_t *pBVar5;
  SC_Cell *pSVar6;
  SC_WireLoad *pSVar7;
  size_t sVar8;
  char *__dest;
  Vec_Flt_t *pVVar9;
  Vec_Ptr_t *pVVar10;
  void **ppvVar11;
  float *pfVar12;
  Vec_Flt_t *pVVar13;
  float *__ptr;
  Vec_Flt_t *pVVar14;
  float *__ptr_00;
  Vec_Flt_t *pVVar15;
  float *__ptr_01;
  long lVar16;
  long lVar17;
  float Area;
  
  pBVar5 = (Bus_Man_t *)calloc(1,0x60);
  pBVar5->pPars = pPars;
  pBVar5->pNtk = pNtk;
  pBVar5->pLib = pLib;
  pSVar6 = Abc_SclFindInvertor(pLib,pPars->fAddBufs);
  pBVar5->pInv = pSVar6->pRepr->pPrev;
  if (pPars->fUseWireLoads != 0) {
    if (pNtk->pWLoadUsed == (char *)0x0) {
      lVar17 = (long)pNtk->vObjs->nSize;
      if (lVar17 < 1) {
        Area = 0.0;
      }
      else {
        Area = 0.0;
        lVar16 = 0;
        do {
          plVar2 = (long *)pNtk->vObjs->pArray[lVar16];
          if ((((plVar2 != (long *)0x0) && ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 7)) &&
              (*(int *)((long)plVar2 + 0x1c) != 0)) &&
             (((lVar3 = *plVar2, *(int *)((long)plVar2 + 0x1c) != 1 || (*(int *)(lVar3 + 4) != 4))
              || (plVar2[7] != 0)))) {
            iVar4 = (int)plVar2[2];
            if (((long)iVar4 < 0) || (*(int *)(*(long *)(lVar3 + 0x178) + 4) <= iVar4)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar4 = *(int *)(*(long *)(*(long *)(lVar3 + 0x178) + 8) + (long)iVar4 * 4);
            if (((long)iVar4 < 0) || (*(int *)(*(long *)(lVar3 + 0x170) + 100) <= iVar4)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            Area = Area + *(float *)(*(long *)(*(long *)(*(long *)(lVar3 + 0x170) + 0x68) +
                                              (long)iVar4 * 8) + 0x18);
          }
          lVar16 = lVar16 + 1;
        } while (lVar17 != lVar16);
      }
      pSVar7 = Abc_SclFindWireLoadModel(pLib,Area);
      pBVar5->pWLoadUsed = pSVar7;
      if (pSVar7 != (SC_WireLoad *)0x0) {
        __s = pSVar7->pName;
        if (__s == (char *)0x0) {
          __dest = (char *)0x0;
        }
        else {
          sVar8 = strlen(__s);
          __dest = (char *)malloc(sVar8 + 1);
          strcpy(__dest,__s);
        }
        pNtk->pWLoadUsed = __dest;
      }
    }
    else {
      pSVar7 = Abc_SclFetchWireLoadModel(pLib,pNtk->pWLoadUsed);
      pBVar5->pWLoadUsed = pSVar7;
    }
  }
  pSVar7 = pBVar5->pWLoadUsed;
  if (pSVar7 != (SC_WireLoad *)0x0) {
    iVar4 = Abc_NtkGetFanoutMax(pNtk);
    pVVar9 = Abc_SclFindWireCaps(pSVar7,iVar4);
    pBVar5->vWireCaps = pVVar9;
  }
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nCap = 100;
  pVVar10->nSize = 0;
  ppvVar11 = (void **)malloc(800);
  pVVar10->pArray = ppvVar11;
  pBVar5->vFanouts = pVVar10;
  pVVar10 = pNtk->vObjs;
  uVar1 = pVVar10->nSize;
  pVVar9 = (Vec_Flt_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < uVar1 * 2 + 999) {
    iVar4 = uVar1 * 2 + 1000;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = iVar4;
  lVar17 = (long)iVar4;
  if (iVar4 == 0) {
    pfVar12 = (float *)0x0;
  }
  else {
    pfVar12 = (float *)malloc(lVar17 * 4);
  }
  pVVar9->pArray = pfVar12;
  pBVar5->vCins = pVVar9;
  pVVar13 = (Vec_Flt_t *)malloc(0x10);
  pVVar13->nSize = 0;
  pVVar13->nCap = iVar4;
  if (iVar4 == 0) {
    __ptr = (float *)0x0;
  }
  else {
    __ptr = (float *)malloc(lVar17 * 4);
  }
  pVVar13->pArray = __ptr;
  pBVar5->vETimes = pVVar13;
  pVVar14 = (Vec_Flt_t *)malloc(0x10);
  pVVar14->nSize = 0;
  pVVar14->nCap = iVar4;
  if (iVar4 == 0) {
    __ptr_00 = (float *)0x0;
  }
  else {
    __ptr_00 = (float *)malloc(lVar17 * 4);
  }
  pVVar14->pArray = __ptr_00;
  pBVar5->vLoads = pVVar14;
  pVVar15 = (Vec_Flt_t *)malloc(0x10);
  pVVar15->nSize = 0;
  pVVar15->nCap = iVar4;
  if (iVar4 == 0) {
    __ptr_01 = (float *)0x0;
  }
  else {
    __ptr_01 = (float *)malloc(lVar17 << 2);
  }
  pVVar15->pArray = __ptr_01;
  pBVar5->vDepts = pVVar15;
  if (iVar4 < (int)uVar1) {
    if (pfVar12 == (float *)0x0) {
      pfVar12 = (float *)malloc((long)(int)uVar1 << 2);
    }
    else {
      pfVar12 = (float *)realloc(pfVar12,(long)(int)uVar1 << 2);
    }
    pVVar9->pArray = pfVar12;
    pVVar9->nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset(pVVar9->pArray,0,(ulong)uVar1 * 4);
  }
  pVVar9->nSize = uVar1;
  uVar1 = pVVar10->nSize;
  if (iVar4 < (int)uVar1) {
    if (__ptr == (float *)0x0) {
      pfVar12 = (float *)malloc((long)(int)uVar1 << 2);
    }
    else {
      pfVar12 = (float *)realloc(__ptr,(long)(int)uVar1 << 2);
    }
    pVVar13->pArray = pfVar12;
    pVVar13->nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset(pVVar13->pArray,0,(ulong)uVar1 * 4);
  }
  pVVar13->nSize = uVar1;
  uVar1 = pVVar10->nSize;
  if (iVar4 < (int)uVar1) {
    if (__ptr_00 == (float *)0x0) {
      pfVar12 = (float *)malloc((long)(int)uVar1 << 2);
    }
    else {
      pfVar12 = (float *)realloc(__ptr_00,(long)(int)uVar1 << 2);
    }
    pVVar14->pArray = pfVar12;
    pVVar14->nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset(pVVar14->pArray,0,(ulong)uVar1 * 4);
  }
  pVVar14->nSize = uVar1;
  uVar1 = pVVar10->nSize;
  if (iVar4 < (int)uVar1) {
    if (__ptr_01 == (float *)0x0) {
      pfVar12 = (float *)malloc((long)(int)uVar1 << 2);
    }
    else {
      pfVar12 = (float *)realloc(__ptr_01,(long)(int)uVar1 << 2);
    }
    pVVar15->pArray = pfVar12;
    pVVar15->nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset(pVVar15->pArray,0,(ulong)uVar1 * 4);
  }
  pVVar15->nSize = uVar1;
  pNtk->pBSMan = pBVar5;
  return pBVar5;
}

Assistant:

Bus_Man_t * Bus_ManStart( Abc_Ntk_t * pNtk, SC_Lib * pLib, SC_BusPars * pPars )
{
    Bus_Man_t * p;
    p = ABC_CALLOC( Bus_Man_t, 1 );
    p->pPars     = pPars;
    p->pNtk      = pNtk;
    p->pLib      = pLib;
    p->pInv      = Abc_SclFindInvertor(pLib, pPars->fAddBufs)->pRepr->pPrev;//->pAve;
    if ( pPars->fUseWireLoads )
    { 
        if ( pNtk->pWLoadUsed == NULL )
        {            
            p->pWLoadUsed = Abc_SclFindWireLoadModel( pLib, Abc_SclGetTotalArea(pNtk) );
            if ( p->pWLoadUsed )
            pNtk->pWLoadUsed = Abc_UtilStrsav( p->pWLoadUsed->pName );
        }
        else
            p->pWLoadUsed = Abc_SclFetchWireLoadModel( pLib, pNtk->pWLoadUsed );
    }
    if ( p->pWLoadUsed )
    p->vWireCaps = Abc_SclFindWireCaps( p->pWLoadUsed, Abc_NtkGetFanoutMax(pNtk) );
    p->vFanouts  = Vec_PtrAlloc( 100 );
    p->vCins     = Vec_FltAlloc( 2*Abc_NtkObjNumMax(pNtk) + 1000 );
    p->vETimes   = Vec_FltAlloc( 2*Abc_NtkObjNumMax(pNtk) + 1000 );
    p->vLoads    = Vec_FltAlloc( 2*Abc_NtkObjNumMax(pNtk) + 1000 );
    p->vDepts    = Vec_FltAlloc( 2*Abc_NtkObjNumMax(pNtk) + 1000 );
    Vec_FltFill( p->vCins,   Abc_NtkObjNumMax(pNtk), 0 );
    Vec_FltFill( p->vETimes, Abc_NtkObjNumMax(pNtk), 0 );
    Vec_FltFill( p->vLoads,  Abc_NtkObjNumMax(pNtk), 0 );
    Vec_FltFill( p->vDepts,  Abc_NtkObjNumMax(pNtk), 0 );
    pNtk->pBSMan = p;
    return p;
}